

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

int TasGrid::RuleLocal::getLevel<(TasGrid::RuleLocal::erule)1>(int point)

{
  int iVar1;
  
  if (1 < (uint)point) {
    iVar1 = Maths::intlog2(point + -1);
    point = iVar1 + 1;
  }
  return point;
}

Assistant:

int getLevel(int point) {
        switch(effective_rule) {
            case erule::pwc: {
                int level = 0;
                while(point >= 1){ point /= 3; level += 1; }
                return level;
            }
            case erule::localp:
            case erule::semilocalp:
                return (point == 0) ? 0 : (point == 1) ? 1 : (Maths::intlog2(point - 1) + 1);
            case erule::localp0:
                return Maths::intlog2(point + 1);
            default: // case erule::localpb:
                return (point <= 1) ? 0 : (Maths::intlog2(point - 1) + 1);
        };
    }